

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O3

char __thiscall
rc::detail::BitStream<rc::Random>::next<char>(BitStream<rc::Random> *this,uint nbits)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = 8;
  if ((int)nbits < 8) {
    uVar9 = nbits;
  }
  if (nbits == 0) {
    bVar4 = 0;
  }
  else {
    if ((int)nbits < 1) {
      bVar4 = 0;
    }
    else {
      uVar5 = this->m_numBits;
      bVar4 = 0;
      uVar7 = uVar9;
      do {
        if (uVar5 == 0) {
          uVar2 = Random::next(&this->m_source);
          this->m_bits = uVar2;
          uVar5 = this->m_numBits + 0x40;
        }
        else {
          uVar2 = this->m_bits;
        }
        uVar3 = uVar5;
        if ((int)uVar7 < (int)uVar5) {
          uVar3 = uVar7;
        }
        bVar6 = ~(byte)(-1L << ((byte)uVar3 & 0x3f));
        if (0x3f < (int)uVar3) {
          bVar6 = 0xff;
        }
        if (uVar3 < 0x40) {
          this->m_bits = uVar2 >> ((byte)uVar3 & 0x3f);
        }
        bVar4 = bVar4 | ((byte)uVar2 & bVar6) << ((byte)uVar9 - (char)uVar7 & 0x3f);
        uVar5 = uVar5 - uVar3;
        this->m_numBits = uVar5;
        uVar8 = uVar7 - uVar3;
        bVar1 = (int)uVar3 <= (int)uVar7;
        uVar7 = uVar8;
      } while (uVar8 != 0 && bVar1);
    }
    if (((0x1000000 << ((byte)(uVar9 * 0x1000000 + -0x1000000 >> 0x18) & 0x1f)) >> 0x18 &
        (int)(char)bVar4) != 0) {
      bVar6 = 0;
      if ((int)nbits < 8) {
        bVar6 = (byte)(0xff << ((byte)uVar9 & 0x1f));
      }
      bVar4 = bVar4 | bVar6;
    }
  }
  return bVar4;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}